

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * CMU462::Matrix4x4::rotation(Matrix4x4 *__return_storage_ptr__,double theta,Axis axis)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  if (axis == Z) {
    dVar1 = cos(theta);
    __return_storage_ptr__->entries[0].x = dVar1;
    dVar1 = sin(theta);
    __return_storage_ptr__->entries[1].x = -dVar1;
    __return_storage_ptr__->entries[2].x = 0.0;
    __return_storage_ptr__->entries[3].x = 0.0;
    dVar1 = sin(theta);
    __return_storage_ptr__->entries[0].y = dVar1;
    dVar1 = cos(theta);
    __return_storage_ptr__->entries[1].y = dVar1;
    __return_storage_ptr__->entries[2].y = 0.0;
    __return_storage_ptr__->entries[3].y = 0.0;
    __return_storage_ptr__->entries[0].z = 0.0;
    __return_storage_ptr__->entries[1].z = 0.0;
    uVar2 = 0;
    uVar3 = 0x3ff00000;
  }
  else {
    if (axis == Y) {
      dVar1 = cos(theta);
      __return_storage_ptr__->entries[0].x = dVar1;
      __return_storage_ptr__->entries[1].x = 0.0;
      dVar1 = sin(theta);
      __return_storage_ptr__->entries[2].x = dVar1;
      __return_storage_ptr__->entries[3].x = 0.0;
      __return_storage_ptr__->entries[3].y = 0.0;
      __return_storage_ptr__->entries[0].y = 0.0;
      __return_storage_ptr__->entries[1].y = 1.0;
      __return_storage_ptr__->entries[2].y = 0.0;
      dVar1 = sin(theta);
      __return_storage_ptr__->entries[0].z = -dVar1;
      __return_storage_ptr__->entries[1].z = 0.0;
    }
    else {
      if (axis != X) {
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->entries[0].x = 1.0;
      __return_storage_ptr__->entries[1].x = 0.0;
      __return_storage_ptr__->entries[2].x = 0.0;
      __return_storage_ptr__->entries[3].x = 0.0;
      __return_storage_ptr__->entries[0].y = 0.0;
      dVar1 = cos(theta);
      __return_storage_ptr__->entries[1].y = dVar1;
      dVar1 = sin(theta);
      __return_storage_ptr__->entries[2].y = -dVar1;
      __return_storage_ptr__->entries[3].y = 0.0;
      __return_storage_ptr__->entries[0].z = 0.0;
      dVar1 = sin(theta);
      __return_storage_ptr__->entries[1].z = dVar1;
    }
    dVar1 = cos(theta);
    uVar2 = SUB84(dVar1,0);
    uVar3 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  __return_storage_ptr__->entries[2].z = (double)CONCAT44(uVar3,uVar2);
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[3].w = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::rotation(double theta, Axis axis) {
    Matrix4x4 B;

    switch (axis)
    {
    case Axis::X:
      B(0, 0) = 1.; B(0, 1) = 0.;         B(0, 2) = 0.;           B(0, 3) = 0.;
      B(1, 0) = 0.; B(1, 1) = cos(theta); B(1, 2) = -sin(theta);  B(1, 3) = 0.;
      B(2, 0) = 0.; B(2, 1) = sin(theta); B(2, 2) = cos(theta);   B(2, 3) = 0.;
      B(3, 0) = 0.; B(3, 1) = 0.;          B(3, 2) = 0.;          B(3, 3) = 1.;
      break;
    case Axis::Y:
      B(0, 0) = cos(theta);   B(0, 1) = 0.; B(0, 2) = sin(theta); B(0, 3) = 0.;
      B(1, 0) = 0.;           B(1, 1) = 1.; B(1, 2) = 0.;         B(1, 3) = 0.;
      B(2, 0) = -sin(theta);  B(2, 1) = 0.; B(2, 2) = cos(theta); B(2, 3) = 0.;
      B(3, 0) = 0.;           B(3, 1) = 0.; B(3, 2) = 0.;         B(3, 3) = 1.;
      break;
    case Axis::Z:
      B(0, 0) = cos(theta); B(0, 1) = -sin(theta);  B(0, 2) = 0.; B(0, 3) = 0.;
      B(1, 0) = sin(theta); B(1, 1) = cos(theta);   B(1, 2) = 0.; B(1, 3) = 0.;
      B(2, 0) = 0.;         B(2, 1) = 0.;           B(2, 2) = 1.; B(2, 3) = 0.;
      B(3, 0) = 0.;         B(3, 1) = 0.;           B(3, 2) = 0.; B(3, 3) = 1.;
      break;
    default:
      break;
    }

    return B;
  }